

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

mg_connection *
mg_connect_client_secure
          (mg_client_options *client_options,char *error_buffer,size_t error_buffer_size)

{
  mg_connection *pmVar1;
  undefined1 local_50 [8];
  mg_error_data error;
  mg_init_data init;
  size_t error_buffer_size_local;
  char *error_buffer_local;
  mg_client_options *client_options_local;
  
  memset(&error.text_buffer_size,0,0x18);
  memset(local_50,0,0x18);
  error._0_8_ = error_buffer;
  error.text = (char *)error_buffer_size;
  pmVar1 = mg_connect_client_impl
                     (client_options,1,(mg_init_data *)&error.text_buffer_size,
                      (mg_error_data *)local_50);
  return pmVar1;
}

Assistant:

mg_connection *
mg_connect_client_secure(const struct mg_client_options *client_options,
                         char *error_buffer,
                         size_t error_buffer_size)
{
	struct mg_init_data init;
	struct mg_error_data error;

	memset(&init, 0, sizeof(init));
	memset(&error, 0, sizeof(error));
	error.text_buffer_size = error_buffer_size;
	error.text = error_buffer;
	return mg_connect_client_impl(client_options, 1, &init, &error);
}